

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

int __thiscall ev3dev::sensor::value(sensor *this,uint index)

{
  int iVar1;
  invalid_argument *this_00;
  int in_ESI;
  string *in_stack_00000038;
  device *in_stack_00000040;
  char svalue [7];
  allocator local_49;
  string local_48 [24];
  sensor *in_stack_ffffffffffffffd0;
  char local_24 [6];
  undefined1 uStack_1e;
  int local_c;
  
  local_c = in_ESI;
  iVar1 = num_values(in_stack_ffffffffffffffd0);
  if (iVar1 <= in_ESI) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"index");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  builtin_strncpy(local_24,"value",5);
  uStack_1e = 0;
  local_24[5] = (char)local_c + '0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_24,&local_49);
  iVar1 = device::get_attr_int(in_stack_00000040,in_stack_00000038);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return iVar1;
}

Assistant:

int sensor::value(unsigned index) const {
    if (static_cast<int>(index) >= num_values())
        throw std::invalid_argument("index");

    char svalue[7] = "value0";
    svalue[5] += index;

    return get_attr_int(svalue);
}